

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivateContainer::mousePressEvent(QComboBoxPrivateContainer *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QPoint *pos;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  SubControl sc;
  QStyleOptionComboBox opt;
  undefined4 in_stack_ffffffffffffff08;
  SubControl in_stack_ffffffffffffff0c;
  QFlags<QStyle::SubControl> *in_stack_ffffffffffffff10;
  QStyleOptionComboBox *this_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QPoint local_a8 [2];
  undefined1 local_98 [11];
  undefined1 in_stack_ffffffffffffff73;
  WidgetAttribute in_stack_ffffffffffffff74;
  QWidget *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_98,0xaa,0x90);
  comboStyleOption((QComboBoxPrivateContainer *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QFlags<QStyle::SubControl>::QFlags(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  QFlags<QStyle::SubControl>::QFlags(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  pos = (QPoint *)
        QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = (QStyleOptionComboBox *)in_RDI[1].data;
  QSinglePointEvent::globalPosition((QSinglePointEvent *)0x534f65);
  QPointF::toPoint((QPointF *)in_RDI);
  local_a8[0] = QWidget::mapFromGlobal(in_RDI,pos);
  iVar3 = (**(code **)((long)*pos + 0xd0))(pos,1,local_98,local_a8,in_RDI[1].data);
  bVar2 = QComboBox::isEditable((QComboBox *)this_00);
  if (((bVar2) && (iVar3 == 4)) ||
     ((bVar2 = QComboBox::isEditable((QComboBox *)this_00), !bVar2 && (iVar3 != 0)))) {
    QWidget::setAttribute
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,(bool)in_stack_ffffffffffffff73);
  }
  (**(code **)((in_RDI[1].data)->winid + 0x1b0))();
  QStyleOptionComboBox::~QStyleOptionComboBox(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivateContainer::mousePressEvent(QMouseEvent *e)
{

    QStyleOptionComboBox opt = comboStyleOption();
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_ComboBoxArrow;
    QStyle::SubControl sc = combo->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt,
                                                           combo->mapFromGlobal(e->globalPosition().toPoint()),
                                                           combo);
    if ((combo->isEditable() && sc == QStyle::SC_ComboBoxArrow)
        || (!combo->isEditable() && sc != QStyle::SC_None))
        setAttribute(Qt::WA_NoMouseReplay);
    combo->hidePopup();
}